

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

ConcurrentAssertionStatementSyntax * __thiscall
slang::parsing::Parser::parseConcurrentAssertion
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  bool bVar1;
  TokenKind TVar2;
  PropertySpecSyntax *propertySpec;
  ActionBlockSyntax *action;
  ConcurrentAssertionStatementSyntax *pCVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  pointer ppAVar5;
  Token openParen;
  Token closeParen;
  Token local_c8;
  SyntaxKind local_b4;
  pointer local_b0;
  size_t local_a8;
  Token local_a0;
  NamedLabelSyntax *local_90;
  Token local_88;
  Token local_78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  _Var4 = attributes._M_extent._M_extent_value;
  ppAVar5 = attributes._M_ptr;
  Token::Token(&local_c8);
  local_a0 = ParserBase::consume(&this->super_ParserBase);
  TVar2 = local_a0.kind;
  local_b0 = ppAVar5;
  local_a8 = _Var4._M_extent_value;
  local_90 = label;
  if (TVar2 < CoverKeyword) {
    if (TVar2 == AssertKeyword) {
      local_c8 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      local_b4 = AssertPropertyStatement;
    }
    else {
      local_c8 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      local_b4 = AssumePropertyStatement;
    }
  }
  else if (TVar2 == CoverKeyword) {
    bVar1 = ParserBase::peek(&this->super_ParserBase,SequenceKeyword);
    if (bVar1) {
      local_c8 = ParserBase::consume(&this->super_ParserBase);
      local_b4 = CoverSequenceStatement;
    }
    else {
      local_c8 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      local_b4 = CoverPropertyStatement;
    }
  }
  else {
    local_b4 = ExpectPropertyStatement;
    if (TVar2 != ExpectKeyword) {
      local_c8 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      local_b4 = RestrictPropertyStatement;
    }
  }
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  propertySpec = parsePropertySpec(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  action = parseActionBlock(this);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.childCount = local_a8;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_b0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_a8;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b0da0;
  local_88 = closeParen;
  local_78 = openParen;
  pCVar3 = slang::syntax::SyntaxFactory::concurrentAssertionStatement
                     (&this->factory,local_b4,local_90,&local_68,local_a0,local_c8,openParen,
                      propertySpec,closeParen,action);
  return pCVar3;
}

Assistant:

ConcurrentAssertionStatementSyntax& Parser::parseConcurrentAssertion(NamedLabelSyntax* label,
                                                                     AttrList attributes) {

    SyntaxKind kind = SyntaxKind::Unknown;
    Token propertyOrSequence;
    auto keyword = consume();

    switch (keyword.kind) {
        case TokenKind::AssertKeyword:
            kind = SyntaxKind::AssertPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::AssumeKeyword:
            kind = SyntaxKind::AssumePropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::CoverKeyword:
            if (peek(TokenKind::SequenceKeyword)) {
                kind = SyntaxKind::CoverSequenceStatement;
                propertyOrSequence = consume();
            }
            else {
                kind = SyntaxKind::CoverPropertyStatement;
                propertyOrSequence = expect(TokenKind::PropertyKeyword);
            }
            break;
        case TokenKind::RestrictKeyword:
            kind = SyntaxKind::RestrictPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::ExpectKeyword:
            kind = SyntaxKind::ExpectPropertyStatement;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& spec = parsePropertySpec();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& action = parseActionBlock();

    return factory.concurrentAssertionStatement(kind, label, attributes, keyword,
                                                propertyOrSequence, openParen, spec, closeParen,
                                                action);
}